

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O0

formatters __thiscall bandit::detail::options::formatter(options *this)

{
  bool bVar1;
  const_reference pvVar2;
  char *local_60;
  allocator local_39;
  string local_38 [8];
  string arg;
  options *this_local;
  
  pvVar2 = std::vector<option::Option,_std::allocator<option::Option>_>::operator[]
                     (&this->options_,5);
  if (pvVar2->arg == (char *)0x0) {
    local_60 = "";
  }
  else {
    pvVar2 = std::vector<option::Option,_std::allocator<option::Option>_>::operator[]
                       (&this->options_,5);
    local_60 = pvVar2->arg;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,local_60,&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,"vs");
  this_local._4_4_ = (formatters)bVar1;
  std::__cxx11::string::~string(local_38);
  return this_local._4_4_;
}

Assistant:

formatters formatter() const
      {
        std::string arg = options_[FORMATTER].arg ? options_[FORMATTER].arg : "";
        if(arg == "vs")
        {
          return formatters::FORMATTER_VS;
        }

        return formatters::FORMATTER_DEFAULT;
      }